

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

String * __thiscall
glcts::LayoutBindingBaseCase::generateLog<tcu::RGBA,tcu::RGBA>
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,String *msg,RGBA result,
          RGBA expected)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StringStream s;
  undefined1 local_1a8 [112];
  undefined **local_138;
  undefined8 local_60;
  undefined2 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  std::ios_base::ios_base((ios_base *)&local_138);
  local_138 = (undefined **)glUniformMatrix3x2fv;
  local_60 = 0;
  local_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1a8._0_8_ = &PTR__StringStream_02138dd0;
  local_138 = &PTR__StringStream_02138df8;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," expected: ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"RGBA(",5);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,expected.m_value & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,expected.m_value >> 8 & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,expected.m_value >> 0x10 & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,expected.m_value >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," actual: ",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"RGBA(",5);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,result.m_value & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,result.m_value >> 8 & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,result.m_value >> 0x10 & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,result.m_value >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x15])(this,0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var,iVar1),
                      ((undefined8 *)CONCAT44(extraout_var,iVar1))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x15])(this,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var_00,iVar1),
                      ((undefined8 *)CONCAT44(extraout_var_00,iVar1))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

String generateLog(const String& msg, T0 result, T1 expected)
	{
		StringStream s;
		s << msg << " expected: " << expected << " actual: " << result << "\n";
		s << getSource(VertexShader) << "\n";
		s << getSource(FragmentShader) << "\n";
		return s.str();
	}